

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O0

int pfx_table_copy_except_socket(pfx_table *src_table,pfx_table *dst_table,rtr_socket *socket)

{
  long in_FS_OFFSET;
  rtr_socket *socket_local;
  pfx_table *dst_table_local;
  pfx_table *src_table_local;
  pfx_table *local_28;
  copy_cb_args args;
  
  args._16_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  args.socket._0_1_ = 0;
  local_28 = dst_table;
  args.pfx_table = (pfx_table *)socket;
  pfx_table_for_each_ipv4_record(src_table,pfx_table_copy_cb,&local_28);
  if (((byte)args.socket & 1) == 0) {
    pfx_table_for_each_ipv6_record(src_table,pfx_table_copy_cb,&local_28);
    if (((byte)args.socket & 1) == 0) {
      src_table_local._4_4_ = 0;
    }
    else {
      src_table_local._4_4_ = -1;
    }
  }
  else {
    src_table_local._4_4_ = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == args._16_8_) {
    return src_table_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

int pfx_table_copy_except_socket(struct pfx_table *src_table, struct pfx_table *dst_table,
				 const struct rtr_socket *socket)
{
	struct copy_cb_args args = {dst_table, socket, false};

	pfx_table_for_each_ipv4_record(src_table, pfx_table_copy_cb, &args);
	if (args.error)
		return PFX_ERROR;

	pfx_table_for_each_ipv6_record(src_table, pfx_table_copy_cb, &args);
	if (args.error)
		return PFX_ERROR;

	return PFX_SUCCESS;
}